

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btWheelInfo>::push_back
          (btAlignedObjectArray<btWheelInfo> *this,btWheelInfo *_Val)

{
  int iVar1;
  int iVar2;
  btAlignedObjectArray<btWheelInfo> *in_RSI;
  btWheelInfo *in_RDI;
  int sz;
  btWheelInfo *in_stack_ffffffffffffffd8;
  int _Count;
  
  iVar1 = size((btAlignedObjectArray<btWheelInfo> *)in_RDI);
  _Count = iVar1;
  iVar2 = capacity((btAlignedObjectArray<btWheelInfo> *)in_RDI);
  if (iVar1 == iVar2) {
    iVar1 = size((btAlignedObjectArray<btWheelInfo> *)in_RDI);
    allocSize((btAlignedObjectArray<btWheelInfo> *)in_RDI,iVar1);
    reserve(in_RSI,_Count);
  }
  btWheelInfo::btWheelInfo(in_RDI,in_stack_ffffffffffffffd8);
  (in_RDI->m_raycastInfo).m_contactNormalWS.m_floats[1] =
       (btScalar)((int)(in_RDI->m_raycastInfo).m_contactNormalWS.m_floats[1] + 1);
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}